

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

void tcu::getCubeArrayLevelFaces
               (TextureCubeArrayView *texture,int levelNdx,int layerNdx,
               ConstPixelBufferAccess (*out) [6])

{
  int iVar1;
  ConstPixelBufferAccess *access;
  int faceNdx;
  long lVar2;
  undefined1 local_50 [16];
  TextureFormat local_40;
  TextureFormat TStack_38;
  TextureFormat local_30;
  
  access = texture->m_levels + levelNdx;
  lVar2 = 0;
  do {
    iVar1 = getCubeArrayFaceIndex((CubeFace)lVar2);
    getSubregion((ConstPixelBufferAccess *)local_50,access,0,0,iVar1 + layerNdx * 6,
                 (access->m_size).m_data[0],(access->m_size).m_data[1],1);
    *(TextureFormat *)((long)out + 0x20) = local_30;
    *(TextureFormat *)((long)out + 0x10) = local_40;
    *(TextureFormat *)((long)out + 0x18) = TStack_38;
    ((TextureFormat *)out)->order = local_50._0_4_;
    ((TextureFormat *)out)->type = local_50._4_4_;
    ((TextureFormat *)((long)out + 8))->order = local_50._8_4_;
    ((TextureFormat *)((long)out + 8))->type = local_50._12_4_;
    lVar2 = lVar2 + 1;
    out = (ConstPixelBufferAccess (*) [6])((long)out + 0x28);
  } while (lVar2 != 6);
  return;
}

Assistant:

static void getCubeArrayLevelFaces (const TextureCubeArrayView& texture, const int levelNdx, const int layerNdx, ConstPixelBufferAccess (&out)[CUBEFACE_LAST])
{
	const ConstPixelBufferAccess&	level		= texture.getLevel(levelNdx);
	const int						layerDepth	= layerNdx * 6;

	for (int faceNdx = 0; faceNdx < CUBEFACE_LAST; faceNdx++)
	{
		const CubeFace face = (CubeFace)faceNdx;
		out[faceNdx] = getSubregion(level, 0, 0, layerDepth + getCubeArrayFaceIndex(face), level.getWidth(), level.getHeight(), 1);
	}
}